

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O0

void __thiscall
MockExpectedCallsList::deleteAllExpectationsAndClearList(MockExpectedCallsList *this)

{
  MockExpectedCallsListNode *pMVar1;
  MockCheckedExpectedCall *pMVar2;
  MockExpectedCallsListNode *next;
  MockExpectedCallsList *this_local;
  
  while (this->head_ != (MockExpectedCallsListNode *)0x0) {
    pMVar1 = this->head_->next_;
    pMVar2 = this->head_->expectedCall_;
    if (pMVar2 != (MockCheckedExpectedCall *)0x0) {
      (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[1])();
    }
    if (this->head_ != (MockExpectedCallsListNode *)0x0) {
      operator_delete(this->head_,0x10);
    }
    this->head_ = pMVar1;
  }
  return;
}

Assistant:

void MockExpectedCallsList::deleteAllExpectationsAndClearList()
{
    while (head_) {
        MockExpectedCallsListNode* next = head_->next_;
        delete head_->expectedCall_;
        delete head_;
        head_ = next;
    }
}